

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncResult.h
# Opt level: O1

int __thiscall nrg::AsyncResult<int>::Impl::getResult(Impl *this)

{
  int iVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->guard_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (((this->result_).super__Optional_base<int,_false>._M_engaged == false) &&
     ((this->result_).super__Optional_base<int,_false>._M_engaged == false)) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cond_);
    } while ((this->result_).super__Optional_base<int,_false>._M_engaged != true);
  }
  iVar1 = (this->result_).super__Optional_base<int,_false>.field_0._M_payload;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return iVar1;
}

Assistant:

R getResult() const {
            std::unique_lock<std::mutex> lock(guard_);
            if (result_) {
                return *result_;
            }

            cond_.wait(lock, [this]() { return static_cast<bool>(result_); });
            return *result_;
        }